

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IF_Spline.H
# Opt level: O3

void __thiscall
amrex::EB2::SplineIF::addSplineElement
          (SplineIF *this,vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> *pts)

{
  pointer *pppdVar1;
  iterator __position;
  SplineDistFcnElement2d *this_00;
  SplineDistFcnElement2d *local_40;
  vector<amrex::RealVect,_std::allocator<amrex::RealVect>_> local_38;
  
  this_00 = (SplineDistFcnElement2d *)operator_new(0x98);
  (this_00->super_distFcnElement2d)._vptr_distFcnElement2d =
       (_func_int **)&PTR_newDistFcnElement2d_0080e040;
  memset(&this_00->control_points_x,0,0x90);
  std::vector<amrex::RealVect,_std::allocator<amrex::RealVect>_>::vector(&local_38,pts);
  SplineDistFcnElement2d::set_control_points(this_00,&local_38);
  if (local_38.super__Vector_base<amrex::RealVect,_std::allocator<amrex::RealVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<amrex::RealVect,_std::allocator<amrex::RealVect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<amrex::RealVect,_std::allocator<amrex::RealVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<amrex::RealVect,_std::allocator<amrex::RealVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  SplineDistFcnElement2d::calc_D(this_00,false);
  __position._M_current =
       (this->geomElements).
       super_vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>.
       super__Vector_base<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->geomElements).
      super_vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>.
      super__Vector_base<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_40 = this_00;
    std::vector<amrex::distFcnElement2d*,std::allocator<amrex::distFcnElement2d*>>::
    _M_realloc_insert<amrex::distFcnElement2d*>
              ((vector<amrex::distFcnElement2d*,std::allocator<amrex::distFcnElement2d*>> *)this,
               __position,(distFcnElement2d **)&local_40);
  }
  else {
    *__position._M_current = (distFcnElement2d *)this_00;
    pppdVar1 = &(this->geomElements).
                super_vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>.
                super__Vector_base<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppdVar1 = *pppdVar1 + 1;
  }
  return;
}

Assistant:

void addSplineElement(std::vector<amrex::RealVect> pts) {
    SplineDistFcnElement2d * theSpline = new SplineDistFcnElement2d();
    theSpline->set_control_points(pts);
    theSpline->calc_D();
    geomElements.push_back(theSpline);
  }